

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
               (void)

{
  ostream *poVar1;
  rep millis;
  time_point t2;
  IMove m;
  time_point t1;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> bot;
  int i;
  IBoard game;
  ostream *in_stack_ffffffffffffff38;
  IBoard *in_stack_ffffffffffffff40;
  IBoard *in_stack_ffffffffffffff48;
  MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *in_stack_ffffffffffffff50;
  type in_stack_ffffffffffffff70;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  rep local_68;
  undefined8 local_60;
  IMove local_48;
  undefined8 local_40;
  int local_1c;
  
  uttt::IBoard::IBoard(in_stack_ffffffffffffff40);
  for (local_1c = 1; local_1c < 0xd; local_1c = local_1c + 1) {
    generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::MinimaxBot
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    local_40 = std::chrono::_V2::system_clock::now();
    local_48 = generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::
               MakeMove((MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *)
                        in_stack_ffffffffffffff70.__r);
    local_60 = std::chrono::_V2::system_clock::now();
    in_stack_ffffffffffffff70 =
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff48,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_ffffffffffffff40);
    local_70.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   in_stack_ffffffffffffff38);
    local_68 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_70);
    poVar1 = std::operator<<((ostream *)&std::cout,"Depth: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    in_stack_ffffffffffffff50 =
         (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *)
         std::operator<<(poVar1," in ");
    in_stack_ffffffffffffff48 =
         (IBoard *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffff50,local_68);
    std::operator<<((ostream *)in_stack_ffffffffffffff48," milliseconds\n");
    in_stack_ffffffffffffff40 = (IBoard *)std::operator<<((ostream *)&std::cout,"Move: ");
    in_stack_ffffffffffffff38 =
         (ostream *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffff40,local_48);
    std::operator<<(in_stack_ffffffffffffff38,'\n');
    generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::~MinimaxBot
              ((MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *)0x1f8a02);
  }
  return;
}

Assistant:

void
BotTest()
{
    IGame game;
    for (int i = 1; i < 13; ++i)
    {
        IBot bot(&game, i);
        auto t1 = std::chrono::high_resolution_clock::now();
        auto m = bot.MakeMove();
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Depth: " << i << " in " << millis << " milliseconds\n";
        std::cout << "Move: " << m << '\n';
    }
}